

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::ReservoirQuantileState<signed_char>,signed_char,duckdb::ReservoirQuantileListOperation<signed_char>>
               (char *idata,AggregateInputData *aggr_input_data,
               ReservoirQuantileState<signed_char> **states,ValidityMask *mask,idx_t count)

{
  bool bVar1;
  unsigned_long uVar2;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  AggregateInputData *in_RSI;
  AggregateUnaryInput *in_R8;
  idx_t *i;
  AggregateUnaryInput input_1;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t *base_idx;
  AggregateUnaryInput input;
  AggregateInputData *in_stack_ffffffffffffff70;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff78;
  AggregateUnaryInput *in_stack_ffffffffffffff80;
  AggregateUnaryInput *unary_input;
  char *in_stack_ffffffffffffff88;
  ReservoirQuantileState<signed_char> *in_stack_ffffffffffffff90;
  unsigned_long local_60;
  ulong local_58;
  ulong local_50;
  idx_t *local_48;
  AggregateUnaryInput local_40;
  AggregateUnaryInput *local_28;
  TemplatedValidityMask<unsigned_long> *local_20;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  bVar1 = ReservoirQuantileOperation::IgnoreNull();
  if ((!bVar1) || (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_20), bVar1)) {
    AggregateUnaryInput::AggregateUnaryInput
              ((AggregateUnaryInput *)&stack0xffffffffffffff70,local_10,(ValidityMask *)local_20);
    for (unary_input = (AggregateUnaryInput *)0x0; unary_input < local_28;
        unary_input = (AggregateUnaryInput *)((long)&unary_input->input + 1)) {
      ReservoirQuantileOperation::
      Operation<signed_char,duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileListOperation<signed_char>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,unary_input);
    }
  }
  else {
    AggregateUnaryInput::AggregateUnaryInput(&local_40,local_10,(ValidityMask *)local_20);
    local_48 = &local_40.input_idx;
    local_40.input_idx = 0;
    local_50 = TemplatedValidityMask<unsigned_long>::EntryCount(0x1daed64);
    for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
      local_60 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_ffffffffffffff78,(idx_t)in_stack_ffffffffffffff70);
      uVar2 = MinValue<unsigned_long>(*local_48 + 0x40,(unsigned_long)local_28);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_60);
      if (bVar1) {
        while (*local_48 < uVar2) {
          ReservoirQuantileOperation::
          Operation<signed_char,duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileListOperation<signed_char>>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          *local_48 = *local_48 + 1;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_60);
        if (bVar1) {
          *local_48 = uVar2;
        }
        else {
          in_stack_ffffffffffffff90 = (ReservoirQuantileState<signed_char> *)*local_48;
          while (*local_48 < uVar2) {
            in_stack_ffffffffffffff88 = (char *)(*local_48 - (long)in_stack_ffffffffffffff90);
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              (&local_60,(idx_t *)&stack0xffffffffffffff88);
            if (bVar1) {
              ReservoirQuantileOperation::
              Operation<signed_char,duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileListOperation<signed_char>>
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff80);
            }
            *local_48 = *local_48 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}